

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O0

void __thiscall CodeGen::generateEnumTraits(CodeGen *this,NodePtr *n)

{
  int iVar1;
  type pNVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar4;
  shared_ptr<avro::Node> *in_RSI;
  long in_RDI;
  string last;
  string first;
  size_t c;
  string fn;
  string dname;
  Name *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffe30;
  CodeGen *in_stack_fffffffffffffe38;
  string local_a8 [32];
  string local_88 [32];
  undefined8 local_68;
  string local_50 [32];
  string local_30 [32];
  shared_ptr<avro::Node> *local_10;
  
  local_10 = in_RSI;
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  (*pNVar2->_vptr_Node[3])();
  decorate_abi_cxx11_(in_stack_fffffffffffffde8);
  fullname(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
  iVar1 = (*pNVar2->_vptr_Node[7])();
  local_68 = CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::string(local_a8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator=(local_88,(string *)(in_RDI + 0x18));
    std::__cxx11::string::operator+=(local_88,"::");
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    iVar1 = (*pNVar2->_vptr_Node[8])(pNVar2,0);
    std::__cxx11::string::operator+=(local_88,(string *)CONCAT44(extraout_var_00,iVar1));
    std::__cxx11::string::operator=(local_a8,(string *)(in_RDI + 0x18));
    std::__cxx11::string::operator+=(local_a8,"::");
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    iVar1 = (*pNVar2->_vptr_Node[8])(pNVar2,(ulong)((int)local_68 - 1));
    std::__cxx11::string::operator+=(local_a8,(string *)CONCAT44(extraout_var_01,iVar1));
  }
  else {
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    iVar1 = (*pNVar2->_vptr_Node[8])(pNVar2,0);
    std::__cxx11::string::operator=(local_88,(string *)CONCAT44(extraout_var_02,iVar1));
    pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
    iVar1 = (*pNVar2->_vptr_Node[8])(pNVar2,(ulong)((int)local_68 - 1));
    std::__cxx11::string::operator=(local_a8,(string *)CONCAT44(extraout_var_03,iVar1));
  }
  poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),"template<> struct codec_traits<");
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4,"> {\n");
  poVar4 = std::operator<<(poVar4,"    static void encode(Encoder& e, ");
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4," v) {\n");
  poVar4 = std::operator<<(poVar4,"\t\tif (v < ");
  poVar4 = std::operator<<(poVar4,local_88);
  poVar4 = std::operator<<(poVar4," || v > ");
  poVar4 = std::operator<<(poVar4,local_a8);
  poVar4 = std::operator<<(poVar4,")\n");
  poVar4 = std::operator<<(poVar4,"\t\t{\n");
  poVar4 = std::operator<<(poVar4,"\t\t\tstd::ostringstream error;\n");
  poVar4 = std::operator<<(poVar4,"\t\t\terror << \"enum value \" << v << \" is out of bound for ");
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4," and cannot be encoded\";\n");
  poVar4 = std::operator<<(poVar4,"\t\t\tthrow avro::Exception(error.str());\n");
  poVar4 = std::operator<<(poVar4,"\t\t}\n");
  poVar4 = std::operator<<(poVar4,"        e.encodeEnum(v);\n");
  poVar4 = std::operator<<(poVar4,"    }\n");
  poVar4 = std::operator<<(poVar4,"    static void decode(Decoder& d, ");
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4,"& v) {\n");
  poVar4 = std::operator<<(poVar4,"\t\tsize_t index = d.decodeEnum();\n");
  poVar4 = std::operator<<(poVar4,"\t\tif (index < ");
  poVar4 = std::operator<<(poVar4,local_88);
  poVar4 = std::operator<<(poVar4," || index > ");
  poVar4 = std::operator<<(poVar4,local_a8);
  poVar4 = std::operator<<(poVar4,")\n");
  poVar4 = std::operator<<(poVar4,"\t\t{\n");
  poVar4 = std::operator<<(poVar4,"\t\t\tstd::ostringstream error;\n");
  poVar4 = std::operator<<(poVar4,
                           "\t\t\terror << \"enum value \" << index << \" is out of bound for ");
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4," and cannot be decoded\";\n");
  poVar4 = std::operator<<(poVar4,"\t\t\tthrow avro::Exception(error.str());\n");
  poVar4 = std::operator<<(poVar4,"\t\t}\n");
  poVar4 = std::operator<<(poVar4,"        v = static_cast<");
  poVar4 = std::operator<<(poVar4,local_50);
  poVar4 = std::operator<<(poVar4,">(index);\n");
  poVar4 = std::operator<<(poVar4,"    }\n");
  std::operator<<(poVar4,"};\n\n");
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void CodeGen::generateEnumTraits(const NodePtr& n)
{
	string dname = decorate(n->name());
	string fn = fullname(dname);
	size_t c = n->names();
	string first; 
	string last;
	if (!ns_.empty())
	{
		first = ns_;
		first += "::";
		first += n->nameAt(0);

		last = ns_;
		last += "::";
		last += n->nameAt(c-1);
	} else {
		first = n->nameAt(0);
		last = n->nameAt(c-1);
	}
	os_ << "template<> struct codec_traits<" << fn << "> {\n"
		<< "    static void encode(Encoder& e, " << fn << " v) {\n"
		<< "		if (v < "  << first << " || v > " << last << ")\n" 
		<< "		{\n"
		<< "			std::ostringstream error;\n"
		<< "			error << \"enum value \" << v << \" is out of bound for " << fn << " and cannot be encoded\";\n"
		<< "			throw avro::Exception(error.str());\n"
		<< "		}\n"
		<< "        e.encodeEnum(v);\n"
		<< "    }\n"
		<< "    static void decode(Decoder& d, " << fn << "& v) {\n"
		<< "		size_t index = d.decodeEnum();\n"
		<< "		if (index < " << first << " || index > " << last << ")\n" 
		<< "		{\n"
		<< "			std::ostringstream error;\n"
		<< "			error << \"enum value \" << index << \" is out of bound for " << fn << " and cannot be decoded\";\n"
		<< "			throw avro::Exception(error.str());\n"
		<< "		}\n"
		<< "        v = static_cast<" << fn << ">(index);\n"
		<< "    }\n"
		<< "};\n\n";
}